

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_prec.c
# Opt level: O1

void av1_pick_and_set_high_precision_mv(AV1_COMP *cpi,int qindex)

{
  undefined4 uVar1;
  undefined4 uVar2;
  MV_PREC_LOGIC MVar3;
  MvCosts *pMVar4;
  bool bVar5;
  long lVar6;
  int **ppiVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float score;
  float local_5c;
  undefined8 local_58;
  float local_50;
  undefined1 local_4c [16];
  undefined1 local_3c [16];
  undefined1 local_2c [16];
  undefined8 local_1c;
  float local_14;
  
  bVar5 = qindex < 0x80;
  MVar3 = (cpi->sf).hl_sf.high_precision_mv_usage;
  if (MVar3 == '\x02') {
    bVar5 = false;
  }
  else if ((((MVar3 == '\0') && (((cpi->common).current_frame.frame_type & 0xfd) != 0)) &&
           (((cpi->ppi->gf_group).update_type[cpi->gf_frame_index] & 0xfe) != 4)) &&
          ((cpi->mv_stats).valid != 0)) {
    fVar8 = (float)((cpi->common).height * (cpi->common).width);
    local_58 = CONCAT44((float)(cpi->mv_stats).q,(float)qindex);
    local_50 = (float)(int)((cpi->common).current_frame.order_hint - (cpi->mv_stats).order);
    auVar13._0_4_ = (float)(cpi->mv_stats).inter_count;
    auVar13._4_4_ = (float)(cpi->mv_stats).intra_count;
    auVar13._8_4_ = (float)(cpi->mv_stats).default_mvs;
    auVar13._12_4_ = (float)(cpi->mv_stats).mv_joint_count[0];
    auVar14._4_4_ = fVar8;
    auVar14._0_4_ = fVar8;
    auVar14._8_4_ = fVar8;
    auVar14._12_4_ = fVar8;
    local_4c = divps(auVar13,auVar14);
    auVar10._0_4_ = (float)(cpi->mv_stats).mv_joint_count[1];
    auVar10._4_4_ = (float)(cpi->mv_stats).mv_joint_count[2];
    auVar10._8_4_ = (float)(cpi->mv_stats).mv_joint_count[3];
    auVar10._12_4_ = (float)(cpi->mv_stats).last_bit_zero;
    local_3c = divps(auVar10,auVar14);
    auVar11._0_4_ = (float)(cpi->mv_stats).last_bit_nonzero;
    auVar11._4_4_ = (float)(cpi->mv_stats).total_mv_rate;
    auVar11._8_4_ = (float)(cpi->mv_stats).hp_total_mv_rate;
    auVar11._12_4_ = (float)(cpi->mv_stats).lp_total_mv_rate;
    local_2c = divps(auVar11,auVar14);
    uVar1 = (cpi->mv_stats).horz_text;
    uVar2 = (cpi->mv_stats).vert_text;
    auVar12._0_4_ = (float)(int)uVar1;
    auVar12._4_4_ = (float)(int)uVar2;
    auVar12._8_8_ = 0;
    auVar13 = divps(auVar12,auVar14);
    local_1c = auVar13._0_8_;
    local_14 = (float)(cpi->mv_stats).diag_text / fVar8;
    lVar6 = 0;
    do {
      *(float *)((long)&local_58 + lVar6) =
           (*(float *)((long)&local_58 + lVar6) - *(float *)((long)av1_mv_prec_mean + lVar6)) /
           *(float *)((long)av1_mv_prec_std + lVar6);
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x48);
    local_5c = 0.0;
    (*av1_nn_predict)((float *)&local_58,&av1_mv_prec_dnn_config,1,&local_5c);
    bVar5 = 0.0 <= local_5c;
  }
  pMVar4 = (cpi->td).mb.mv_costs;
  if (pMVar4 != (MvCosts *)0x0) {
    bVar5 = (bool)(bVar5 & (cpi->common).features.cur_frame_force_integer_mv == false);
    (cpi->common).features.allow_high_precision_mv = bVar5;
    auVar9._8_4_ = (int)pMVar4;
    auVar9._0_8_ = pMVar4;
    auVar9._12_4_ = (int)((ulong)pMVar4 >> 0x20);
    pMVar4->nmv_cost_hp[0] = pMVar4->nmv_cost_hp_alloc[0] + 0x3fff;
    pMVar4->nmv_cost_hp[1] = (int *)(auVar9._8_8_ + 0x70000);
    pMVar4->nmv_cost[0] = pMVar4->nmv_cost_alloc[0] + 0x3fff;
    pMVar4->nmv_cost[1] = (int *)(auVar9._8_8_ + 0x30008);
    ppiVar7 = pMVar4->nmv_cost;
    if (bVar5 != false) {
      ppiVar7 = pMVar4->nmv_cost_hp;
    }
    pMVar4->mv_cost_stack = ppiVar7;
  }
  return;
}

Assistant:

void av1_pick_and_set_high_precision_mv(AV1_COMP *cpi, int qindex) {
  int use_hp = qindex < HIGH_PRECISION_MV_QTHRESH;
#if !CONFIG_REALTIME_ONLY
  MV_STATS *mv_stats = &cpi->mv_stats;
#endif  // !CONFIG_REALTIME_ONLY

  if (cpi->sf.hl_sf.high_precision_mv_usage == QTR_ONLY) {
    use_hp = 0;
  }
#if !CONFIG_REALTIME_ONLY
  else if (cpi->sf.hl_sf.high_precision_mv_usage == LAST_MV_DATA &&
           av1_frame_allows_smart_mv(cpi) && mv_stats->valid) {
    use_hp = get_smart_mv_prec(cpi, mv_stats, qindex);
  }
#endif  // !CONFIG_REALTIME_ONLY

  av1_set_high_precision_mv(cpi, use_hp,
                            cpi->common.features.cur_frame_force_integer_mv);
}